

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 fts5ExprSynonymRowid(Fts5ExprTerm *pTerm,int bDesc,int *pbEof)

{
  bool bVar1;
  i64 iRowid;
  Fts5ExprTerm *p;
  long lStack_28;
  int bRetValid;
  i64 iRet;
  int *pbEof_local;
  int bDesc_local;
  Fts5ExprTerm *pTerm_local;
  
  lStack_28 = 0;
  bVar1 = false;
  for (iRowid = (i64)pTerm; iRowid != 0; iRowid = *(i64 *)(iRowid + 0x18)) {
    if ((*(char *)(*(long *)(iRowid + 0x10) + 0x14) == '\0') &&
       ((!bVar1 || (bDesc != (uint)(**(long **)(iRowid + 0x10) < lStack_28))))) {
      bVar1 = true;
      lStack_28 = **(long **)(iRowid + 0x10);
    }
  }
  if ((pbEof != (int *)0x0) && (!bVar1)) {
    *pbEof = 1;
  }
  return lStack_28;
}

Assistant:

static i64 fts5ExprSynonymRowid(Fts5ExprTerm *pTerm, int bDesc, int *pbEof){
  i64 iRet = 0;
  int bRetValid = 0;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  assert( bDesc==0 || bDesc==1 );
  for(p=pTerm; p; p=p->pSynonym){
    if( 0==sqlite3Fts5IterEof(p->pIter) ){
      i64 iRowid = p->pIter->iRowid;
      if( bRetValid==0 || (bDesc!=(iRowid<iRet)) ){
        iRet = iRowid;
        bRetValid = 1;
      }
    }
  }

  if( pbEof && bRetValid==0 ) *pbEof = 1;
  return iRet;
}